

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O0

Vec_Int_t * Bmc_ManBCoreReadPivots(char *pName)

{
  int iVar1;
  Vec_Int_t *p;
  FILE *__stream;
  FILE *pFile;
  Vec_Int_t *vPivots;
  char *pcStack_10;
  int Num;
  char *pName_local;
  
  pcStack_10 = pName;
  p = Vec_IntAlloc(100);
  __stream = fopen(pcStack_10,"r");
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%d",(long)&vPivots + 4);
    if (iVar1 != 1) break;
    Vec_IntPush(p,vPivots._4_4_);
  }
  fclose(__stream);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect pivot variables.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Bmc_ManBCoreReadPivots( char * pName )
{
    int Num;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    FILE * pFile = fopen( pName, "r" );
    while ( fscanf( pFile, "%d", &Num ) == 1 )
        Vec_IntPush( vPivots, Num );
    fclose( pFile );
    return vPivots;
}